

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O0

void P_TranslateTeleportThings(void)

{
  bool bVar1;
  bool bVar2;
  int local_30;
  int i;
  bool foundSomething;
  TThinkerIterator<AActor> iterator;
  AActor *dest;
  
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&i,NAME_TeleportDest,0x80);
  bVar1 = false;
  while (iterator.super_FThinkerIterator._16_8_ =
              TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&i,false),
        (AActor *)iterator.super_FThinkerIterator._16_8_ != (AActor *)0x0) {
    bVar2 = FTagManager::SectorHasTags
                      (&tagManager,((AActor *)iterator.super_FThinkerIterator._16_8_)->Sector);
    if (!bVar2) {
      *(undefined4 *)(iterator.super_FThinkerIterator._16_8_ + 0x290) = 1;
      AActor::AddToHash((AActor *)iterator.super_FThinkerIterator._16_8_);
      bVar1 = true;
    }
  }
  if (bVar1) {
    for (local_30 = 0; local_30 < numlines; local_30 = local_30 + 1) {
      if (lines[local_30].special == 0x46) {
        if (lines[local_30].args[1] == 0) {
          lines[local_30].args[0] = 1;
        }
      }
      else if (lines[local_30].special == 0x47) {
        if (lines[local_30].args[2] == 0) {
          lines[local_30].args[0] = 1;
        }
      }
      else if ((lines[local_30].special == 0x27) && (lines[local_30].args[1] == 0)) {
        lines[local_30].args[0] = 1;
      }
    }
  }
  return;
}

Assistant:

void P_TranslateTeleportThings ()
{
	AActor *dest;
	TThinkerIterator<AActor> iterator(NAME_TeleportDest);
	bool foundSomething = false;

	while ( (dest = iterator.Next()) )
	{
		if (!tagManager.SectorHasTags(dest->Sector))
		{
			dest->tid = 1;
			dest->AddToHash ();
			foundSomething = true;
		}
	}

	if (foundSomething)
	{
		for (int i = 0; i < numlines; ++i)
		{
			if (lines[i].special == Teleport)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_NoFog)
			{
				if (lines[i].args[2] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_ZombieChanger)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
		}
	}
}